

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.h
# Opt level: O2

void __thiscall sc_core::sc_vector_base::~sc_vector_base(sc_vector_base *this)

{
  _Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *this_00;
  
  (this->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_00265ec8;
  this_00 = &this->objs_vec_->
             super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>;
  if (this_00 != (_Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)0x0) {
    std::_Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::~_Vector_base
              (this_00);
  }
  operator_delete(this_00);
  std::_Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>::
  ~_Vector_base(&(this->vec_).
                 super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
               );
  sc_object::~sc_object(&this->super_sc_object);
  return;
}

Assistant:

~sc_vector_base()
    { delete objs_vec_; }